

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O1

void __thiscall OpenMD::Component::Component(Component *this)

{
  _Rb_tree_header *p_Var1;
  ParamMap *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  ParameterBase *local_48;
  string *local_40;
  ParameterBase *local_38;
  
  p_Var1 = &(this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__Component_00305f38;
  local_38 = &(this->Type).super_ParameterBase;
  (this->Type).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_00303298;
  (this->Type).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Type).super_ParameterBase.keyword_.field_2;
  (this->Type).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Type).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Type).super_ParameterBase.optional_ = false;
  (this->Type).super_ParameterBase.defaultValue_ = false;
  (this->Type).super_ParameterBase.empty_ = true;
  (this->Type).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__Parameter_00303308;
  (this->Type).data_._M_dataplus._M_p = (pointer)&(this->Type).data_.field_2;
  (this->Type).data_._M_string_length = 0;
  (this->Type).data_.field_2._M_local_buf[0] = '\0';
  local_48 = &(this->NMol).super_ParameterBase;
  local_40 = (string *)&(this->NMol).super_ParameterBase.keyword_;
  local_50 = &(this->NMol).super_ParameterBase.keyword_.field_2;
  (this->NMol).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_50;
  (this->NMol).super_ParameterBase.keyword_._M_string_length = 0;
  (this->NMol).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->NMol).super_ParameterBase.optional_ = false;
  (this->NMol).super_ParameterBase.defaultValue_ = false;
  (this->NMol).super_ParameterBase.empty_ = true;
  (this->NMol).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_00303c60;
  local_58 = &(this->Region).super_ParameterBase.keyword_.field_2;
  (this->Region).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_58;
  (this->Region).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Region).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Region).super_ParameterBase.optional_ = false;
  (this->Region).super_ParameterBase.defaultValue_ = false;
  (this->Region).super_ParameterBase.empty_ = true;
  (this->Region).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00303c60;
  this->moleculeStamp_ = (MoleculeStamp *)0x0;
  paVar2 = &local_a0.first.field_2;
  local_a0.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"type","");
  std::__cxx11::string::_M_assign((string *)&(this->Type).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0.first._M_dataplus._M_p,local_a0.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_78 = &local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"type","");
  this_00 = &(this->super_DataHolder).parameters_;
  if (local_78 == &local_68) {
    local_a0.first.field_2._8_8_ = local_68._8_8_;
    local_a0.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_a0.first._M_dataplus._M_p = (pointer)local_78;
  }
  local_a0.first.field_2._M_allocated_capacity._1_7_ = local_68._M_allocated_capacity._1_7_;
  local_a0.first.field_2._M_local_buf[0] = local_68._M_local_buf[0];
  local_a0.first._M_string_length = local_70;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_a0.second = local_38;
  local_78 = &local_68;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0.first._M_dataplus._M_p,local_a0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0])
                             + 1);
  }
  local_a0.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"nMol","");
  std::__cxx11::string::_M_assign(local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0.first._M_dataplus._M_p,local_a0.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_78 = &local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"nMol","");
  if (local_78 == &local_68) {
    local_a0.first.field_2._8_8_ = local_68._8_8_;
    local_a0.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_a0.first._M_dataplus._M_p = (pointer)local_78;
  }
  local_a0.first.field_2._M_allocated_capacity._1_7_ = local_68._M_allocated_capacity._1_7_;
  local_a0.first.field_2._M_local_buf[0] = local_68._M_local_buf[0];
  local_a0.first._M_string_length = local_70;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_a0.second = local_48;
  local_78 = &local_68;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0.first._M_dataplus._M_p,local_a0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0])
                             + 1);
  }
  local_a0.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"region","");
  std::__cxx11::string::_M_assign((string *)&(this->Region).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0.first._M_dataplus._M_p,local_a0.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_78 = &local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"region","");
  if (local_78 == &local_68) {
    local_a0.first.field_2._8_8_ = local_68._8_8_;
    local_a0.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_a0.first._M_dataplus._M_p = (pointer)local_78;
  }
  local_a0.first.field_2._M_allocated_capacity._1_7_ = local_68._M_allocated_capacity._1_7_;
  local_a0.first.field_2._M_local_buf[0] = local_68._M_local_buf[0];
  local_a0.first._M_string_length = local_70;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_a0.second = &(this->Region).super_ParameterBase;
  local_78 = &local_68;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0.first._M_dataplus._M_p,local_a0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0])
                             + 1);
  }
  return;
}

Assistant:

Component::Component() : moleculeStamp_(NULL) {
    DefineParameter(Type, "type");
    DefineParameter(NMol, "nMol");
    DefineParameter(Region, "region");
  }